

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

int fp_i4stat(fitsfile *infptr,int naxis,long *naxes,imgstats *imagestats,int *status)

{
  imgstats *piVar1;
  fitsfile *pfVar2;
  int iVar3;
  void *__ptr;
  long lVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  size_t __nmemb;
  int nullvalue;
  long *local_180;
  imgstats *local_178;
  long local_170;
  fitsfile *local_168;
  double noise5;
  double noise3;
  double noise2;
  double noise1;
  double sigma;
  double mean;
  long ngood;
  int tstatus;
  int anynul;
  int maxvalue;
  int minvalue;
  long lpixel [9];
  long fpixel [9];
  long inc [9];
  
  plVar6 = &DAT_0010c160;
  plVar7 = fpixel;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *plVar7 = *plVar6;
    plVar6 = plVar6 + 1;
    plVar7 = plVar7 + 1;
  }
  plVar6 = &DAT_0010c160;
  plVar7 = lpixel;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *plVar7 = *plVar6;
    plVar6 = plVar6 + 1;
    plVar7 = plVar7 + 1;
  }
  plVar6 = &DAT_0010c160;
  plVar7 = inc;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *plVar7 = *plVar6;
    plVar6 = plVar6 + 1;
    plVar7 = plVar7 + 1;
  }
  lVar4 = *naxes;
  lpixel[0] = (long)(XSAMPLE / 2) + lVar4 / 2;
  fpixel[0] = lVar4 / 2 - (long)(XSAMPLE / 2 + -1);
  if (fpixel[0] < 2) {
    fpixel[0] = 1;
  }
  if (lVar4 <= lpixel[0]) {
    lpixel[0] = lVar4;
  }
  lVar4 = lpixel[0] - fpixel[0];
  local_170 = lVar4 + 1;
  if (1 < naxis) {
    lVar4 = naxes[1];
    lpixel[1] = (long)(YSAMPLE / 2) + lVar4 / 2;
    lVar5 = lVar4 / 2 - (long)(YSAMPLE / 2 + -1);
    fpixel[1] = 1;
    if (1 < lVar5) {
      fpixel[1] = lVar5;
    }
    if (lVar4 <= lpixel[1]) {
      lpixel[1] = lVar4;
    }
    lVar4 = lpixel[1] - fpixel[1];
    if (naxis != 2) {
      lpixel[2] = naxes[2] / 2 + 1;
      fpixel[2] = lpixel[2];
    }
  }
  __nmemb = (lVar4 + 1) * local_170;
  local_180 = naxes;
  local_168 = infptr;
  __ptr = calloc(__nmemb,4);
  pfVar2 = local_168;
  if (__ptr == (void *)0x0) {
    *status = 0x71;
    iVar3 = 0x71;
  }
  else {
    local_178 = imagestats;
    ffpscl(0x3ff0000000000000,0,local_168,status);
    plVar6 = local_180;
    local_180 = (long *)status;
    ffgsvk(pfVar2,0,naxis,plVar6,fpixel,lpixel,inc,0,__ptr,&anynul,status);
    tstatus = 0;
    ffgky(pfVar2,0x1f,"BLANK",&nullvalue,0,&tstatus);
    piVar1 = local_178;
    plVar6 = local_180;
    if (tstatus != 0) {
      nullvalue = 0;
    }
    fits_img_stats_int(__ptr,local_170,lVar4 + 1,tstatus == 0,nullvalue,&ngood,&minvalue,&maxvalue,
                       &mean,&sigma,&noise1,&noise2,&noise3,&noise5,local_180);
    piVar1->n_nulls = (int)__nmemb - (int)ngood;
    piVar1->minval = (double)minvalue;
    piVar1->maxval = (double)maxvalue;
    piVar1->mean = mean;
    piVar1->sigma = sigma;
    piVar1->noise1 = noise1;
    piVar1->noise2 = noise2;
    piVar1->noise3 = noise3;
    piVar1->noise5 = noise5;
    free(__ptr);
    iVar3 = (int)*plVar6;
  }
  return iVar3;
}

Assistant:

int fp_i4stat(fitsfile *infptr, int naxis, long *naxes, imgstats *imagestats, int *status)
{
/*
    read the central XSAMPLE by YSAMPLE region of pixels in the int*2 image, 
    and then compute basic statistics: min, max, mean, sigma, mean diff, etc.
*/

	long fpixel[9] = {1,1,1,1,1,1,1,1,1};
	long lpixel[9] = {1,1,1,1,1,1,1,1,1};
	long inc[9]    = {1,1,1,1,1,1,1,1,1};
	long i1, i2, npix, ngood, nx, ny;
	int *intarray, minvalue, maxvalue, nullvalue;
	int anynul, tstatus, checknull = 1;
	double mean, sigma, noise1, noise2, noise3, noise5;
	
         /* select the middle XSAMPLE by YSAMPLE area of the image */
	i1 = naxes[0]/2 - (XSAMPLE/2 - 1);
	i2 = naxes[0]/2 + (XSAMPLE/2);
	if (i1 < 1) i1 = 1;
	if (i2 > naxes[0]) i2 = naxes[0];
	fpixel[0] = i1;
	lpixel[0] = i2;
	nx = i2 - i1 +1;

        if (naxis > 1) {
	    i1 = naxes[1]/2 - (YSAMPLE/2 - 1);
	    i2 = naxes[1]/2 + (YSAMPLE/2);
	    if (i1 < 1) i1 = 1;
	    if (i2 > naxes[1]) i2 = naxes[1];
	    fpixel[1] = i1;
	    lpixel[1] = i2;
	}
	ny = i2 - i1 +1;

	npix = nx * ny;

        /* if there are higher dimensions, read the middle plane of the cube */
	if (naxis > 2) {
	    fpixel[2] = naxes[2]/2 + 1;
	    lpixel[2] = naxes[2]/2 + 1;
	}

	intarray = calloc(npix, sizeof(int));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr, 1.0, 0.0, status);

	fits_read_subset_int(infptr, 0, naxis, naxes, fpixel, lpixel, inc,
	    0, intarray, &anynul, status);

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TINT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   nullvalue = 0;
	   checknull = 0;
	}

	/* compute statistics of the image */

        fits_img_stats_int(intarray, nx, ny, checknull, nullvalue, 
	&ngood, &minvalue, &maxvalue, &mean, &sigma, &noise1, &noise2, &noise3, &noise5, status);

	imagestats->n_nulls = npix - ngood;
	imagestats->minval = minvalue;
	imagestats->maxval = maxvalue; 
	imagestats->mean = mean; 
	imagestats->sigma = sigma; 
	imagestats->noise1 = noise1; 
	imagestats->noise2 = noise2; 
	imagestats->noise3 = noise3; 
	imagestats->noise5 = noise5; 
    
	free(intarray);
	return(*status);
}